

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O0

void __thiscall spvtools::opt::IRContext::BuildInstrToBlockMapping(IRContext *this)

{
  bool bVar1;
  Analysis AVar2;
  type this_00;
  reference this_01;
  reference this_02;
  anon_class_16_2_f791057a local_a0;
  function<void_(spvtools::opt::Instruction_*)> local_90;
  reference local_70;
  value_type *block;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  value_type *fn;
  iterator __end2;
  iterator __begin2;
  Module *__range2;
  IRContext *this_local;
  
  std::
  unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>_>
  ::clear(&this->instr_to_block_);
  this_00 = std::unique_ptr<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>::
            operator*(&this->module_);
  join_0x00000010_0x00000000_ = Module::begin(this_00);
  _fn = Module::end(this_00);
  while( true ) {
    bVar1 = UptrVectorIterator<spvtools::opt::Function,_false>::operator!=
                      ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_,
                       (UptrVectorIterator<spvtools::opt::Function,_false> *)&fn);
    if (!bVar1) break;
    this_01 = UptrVectorIterator<spvtools::opt::Function,_false>::operator*
                        ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
    join_0x00000010_0x00000000_ = Function::begin(this_01);
    _block = Function::end(this_01);
    while( true ) {
      bVar1 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                        ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end3.iterator_,
                         (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&block);
      if (!bVar1) break;
      this_02 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                          ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end3.iterator_
                          );
      local_a0.this = this;
      local_a0.block = this_02;
      local_70 = this_02;
      std::function<void(spvtools::opt::Instruction*)>::
      function<spvtools::opt::IRContext::BuildInstrToBlockMapping()::_lambda(spvtools::opt::Instruction*)_1_,void>
                ((function<void(spvtools::opt::Instruction*)> *)&local_90,&local_a0);
      BasicBlock::ForEachInst(this_02,&local_90,false);
      std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_90);
      UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
                ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end3.iterator_);
    }
    UptrVectorIterator<spvtools::opt::Function,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
  }
  AVar2 = operator|(this->valid_analyses_,kAnalysisInstrToBlockMapping);
  this->valid_analyses_ = AVar2;
  return;
}

Assistant:

void BuildInstrToBlockMapping() {
    instr_to_block_.clear();
    for (auto& fn : *module_) {
      for (auto& block : fn) {
        block.ForEachInst([this, &block](Instruction* inst) {
          instr_to_block_[inst] = &block;
        });
      }
    }
    valid_analyses_ = valid_analyses_ | kAnalysisInstrToBlockMapping;
  }